

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError PaSkeleton_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  PaUtilHostApiRepresentation *block;
  PaUtilAllocationGroup *pPVar1;
  PaDeviceInfo *deviceInfo;
  PaDeviceInfo *deviceInfoArray;
  PaSkeletonHostApiRepresentation *skeletonHostApi;
  int deviceCount;
  int i;
  PaError result;
  PaHostApiIndex hostApiIndex_local;
  PaUtilHostApiRepresentation **hostApi_local;
  
  block = (PaUtilHostApiRepresentation *)PaUtil_AllocateMemory(0x128);
  if (block != (PaUtilHostApiRepresentation *)0x0) {
    pPVar1 = PaUtil_CreateAllocationGroup();
    block[3].privatePaFrontInfo.baseDeviceIndex = (unsigned_long)pPVar1;
    if (block[3].privatePaFrontInfo.baseDeviceIndex != 0) {
      *hostApi = block;
      ((*hostApi)->info).structVersion = 1;
      ((*hostApi)->info).type = paInDevelopment;
      ((*hostApi)->info).name = "skeleton implementation";
      ((*hostApi)->info).defaultInputDevice = -1;
      ((*hostApi)->info).defaultOutputDevice = -1;
      ((*hostApi)->info).deviceCount = 0;
      (*hostApi)->ScanDeviceInfos =
           (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr *)0x0;
      (*hostApi)->CommitDeviceInfos =
           (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_int *)0x0;
      (*hostApi)->DisposeDeviceInfos =
           (_func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *)0x0;
      (*hostApi)->Terminate = Terminate;
      (*hostApi)->OpenStream = OpenStream;
      (*hostApi)->IsFormatSupported = IsFormatSupported;
      (*hostApi)->ScanDeviceInfos =
           (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr *)0x0;
      (*hostApi)->CommitDeviceInfos =
           (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_int *)0x0;
      (*hostApi)->DisposeDeviceInfos =
           (_func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *)0x0;
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)(block + 1),CloseStream,StartStream,StopStream,AbortStream
                 ,IsStreamStopped,IsStreamActive,GetStreamTime,GetStreamCpuLoad,PaUtil_DummyRead,
                 PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,PaUtil_DummyGetWriteAvailable);
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)(block + 2),CloseStream,StartStream,StopStream,AbortStream
                 ,IsStreamStopped,IsStreamActive,GetStreamTime,PaUtil_DummyGetCpuLoad,ReadStream,
                 WriteStream,GetStreamReadAvailable,GetStreamWriteAvailable);
      return 0;
    }
  }
  if (block != (PaUtilHostApiRepresentation *)0x0) {
    if (block[3].privatePaFrontInfo.baseDeviceIndex != 0) {
      PaUtil_FreeAllAllocations
                ((PaUtilAllocationGroup *)block[3].privatePaFrontInfo.baseDeviceIndex);
      PaUtil_DestroyAllocationGroup
                ((PaUtilAllocationGroup *)block[3].privatePaFrontInfo.baseDeviceIndex);
    }
    PaUtil_FreeMemory(block);
  }
  return -0x2708;
}

Assistant:

PaError PaSkeleton_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    int i, deviceCount;
    PaSkeletonHostApiRepresentation *skeletonHostApi;
    PaDeviceInfo *deviceInfoArray;

    skeletonHostApi = (PaSkeletonHostApiRepresentation*)PaUtil_AllocateMemory( sizeof(PaSkeletonHostApiRepresentation) );
    if( !skeletonHostApi )
    {
        result = paInsufficientMemory;
        goto error;
    }

    skeletonHostApi->allocations = PaUtil_CreateAllocationGroup();
    if( !skeletonHostApi->allocations )
    {
        result = paInsufficientMemory;
        goto error;
    }

    *hostApi = &skeletonHostApi->inheritedHostApiRep;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paInDevelopment;            /* IMPLEMENT ME: change to correct type id */
    (*hostApi)->info.name = "skeleton implementation";  /* IMPLEMENT ME: change to correct name */

    (*hostApi)->info.defaultInputDevice = paNoDevice;  /* IMPLEMENT ME */
    (*hostApi)->info.defaultOutputDevice = paNoDevice; /* IMPLEMENT ME */

    (*hostApi)->info.deviceCount = 0;

    deviceCount = 0; /* IMPLEMENT ME */

    if( deviceCount > 0 )
    {
        (*hostApi)->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
                skeletonHostApi->allocations, sizeof(PaDeviceInfo*) * deviceCount );
        if( !(*hostApi)->deviceInfos )
        {
            result = paInsufficientMemory;
            goto error;
        }

        /* allocate all device info structs in a contiguous block */
        deviceInfoArray = (PaDeviceInfo*)PaUtil_GroupAllocateMemory(
                skeletonHostApi->allocations, sizeof(PaDeviceInfo) * deviceCount );
        if( !deviceInfoArray )
        {
            result = paInsufficientMemory;
            goto error;
        }

        for( i=0; i < deviceCount; ++i )
        {
            PaDeviceInfo *deviceInfo = &deviceInfoArray[i];
            deviceInfo->structVersion = 2;
            deviceInfo->hostApi = hostApiIndex;
            deviceInfo->name = 0; /* IMPLEMENT ME: allocate block and copy name eg:
                deviceName = (char*)PaUtil_GroupAllocateMemory( skeletonHostApi->allocations, strlen(srcName) + 1 );
                if( !deviceName )
                {
                    result = paInsufficientMemory;
                    goto error;
                }
                strcpy( deviceName, srcName );
                deviceInfo->name = deviceName;
            */

            deviceInfo->maxInputChannels = 0;  /* IMPLEMENT ME */
            deviceInfo->maxOutputChannels = 0;  /* IMPLEMENT ME */

            deviceInfo->defaultLowInputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultLowOutputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultHighInputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultHighOutputLatency = 0.;  /* IMPLEMENT ME */

            deviceInfo->defaultSampleRate = 0.; /* IMPLEMENT ME */

            (*hostApi)->deviceInfos[i] = deviceInfo;
            ++(*hostApi)->info.deviceCount;
        }
    }

    (*hostApi)->ScanDeviceInfos = NULL;
    (*hostApi)->CommitDeviceInfos = NULL;
    (*hostApi)->DisposeDeviceInfos = NULL;
    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;
    (*hostApi)->ScanDeviceInfos = NULL;
    (*hostApi)->CommitDeviceInfos = NULL;
    (*hostApi)->DisposeDeviceInfos = NULL;

    PaUtil_InitializeStreamInterface( &skeletonHostApi->callbackStreamInterface, CloseStream, StartStream,
                                      StopStream, AbortStream, IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable, PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &skeletonHostApi->blockingStreamInterface, CloseStream, StartStream,
                                      StopStream, AbortStream, IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream, GetStreamReadAvailable, GetStreamWriteAvailable );

    return result;

error:
    if( skeletonHostApi )
    {
        if( skeletonHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( skeletonHostApi->allocations );
            PaUtil_DestroyAllocationGroup( skeletonHostApi->allocations );
        }

        PaUtil_FreeMemory( skeletonHostApi );
    }
    return result;
}